

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int __thiscall phosg::unlink(phosg *this,char *__name)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  runtime_error *prVar6;
  uint *puVar7;
  int error;
  int error_00;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *item;
  iterator __end3;
  iterator __begin3;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool recursive_local;
  string *filename_local;
  
  if (((ulong)__name & 1) == 0) {
    pcVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    uVar2 = ::unlink(pcVar4);
    piVar5 = (int *)(ulong)uVar2;
    if ((uVar2 != 0) && (piVar5 = __errno_location(), *piVar5 != 2)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::operator+(&local_1a8,"can\'t delete file ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      ::std::operator+(&local_188,&local_1a8,": ");
      puVar7 = (uint *)__errno_location();
      string_for_error_abi_cxx11_(&local_1c8,(phosg *)(ulong)*puVar7,error_00);
      ::std::operator+(&local_168,&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8);
      ::std::runtime_error::runtime_error(prVar6,(string *)&local_168);
      __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = (int)piVar5;
  }
  else {
    bVar1 = isdir((string *)this);
    if (bVar1) {
      list_directory((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin3,(string *)this);
      __end3 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3);
      item = (string *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin3);
      while (bVar1 = std::__detail::operator==
                               (&__end3.
                                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_70 = std::__detail::
                   _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                   ::operator*(&__end3);
        ::std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         "/");
        ::std::operator+(&local_90,&local_b0,local_70);
        unlink((phosg *)&local_90,(char *)0x1);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_b0);
        std::__detail::
        _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
        ::operator++(&__end3);
      }
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3);
      pcVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      uVar2 = rmdir(pcVar4);
      piVar5 = (int *)(ulong)uVar2;
      if ((uVar2 != 0) && (piVar5 = __errno_location(), *piVar5 != 2)) {
        local_141 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::operator+(&local_120,"can\'t delete directory ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::operator+(&local_100,&local_120,": ");
        puVar7 = (uint *)__errno_location();
        string_for_error_abi_cxx11_(&local_140,(phosg *)(ulong)*puVar7,error);
        ::std::operator+(&local_e0,&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_140);
        ::std::runtime_error::runtime_error(prVar6,(string *)&local_e0);
        local_141 = 0;
        __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = (int)piVar5;
    }
    else {
      iVar3 = unlink(this,(char *)0x0);
    }
  }
  return iVar3;
}

Assistant:

void unlink(const string& filename, bool recursive) {
  if (recursive) {
    if (isdir(filename)) {
      for (const string& item : list_directory(filename)) {
        unlink(filename + "/" + item, true);
      }
      if ((::rmdir(filename.c_str()) != 0) && (errno != ENOENT)) {
        throw runtime_error("can\'t delete directory " + filename + ": " + string_for_error(errno));
      }
    } else {
      unlink(filename, false);
    }

  } else {
    if ((::unlink(filename.c_str()) != 0) && (errno != ENOENT)) {
      throw runtime_error("can\'t delete file " + filename + ": " + string_for_error(errno));
    }
  }
}